

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O0

Chunk * __thiscall
PageStack<Memory::MarkContext::MarkCandidate>::CreateChunk
          (PageStack<Memory::MarkContext::MarkCandidate> *this)

{
  Chunk *newChunk;
  PageStack<Memory::MarkContext::MarkCandidate> *this_local;
  
  if (this->pageCount < this->maxPageCount) {
    this_local = (PageStack<Memory::MarkContext::MarkCandidate> *)
                 Memory::PagePool::GetPage(this->pagePool,(bool)(this->usesReservedPages & 1));
    if (this_local == (PageStack<Memory::MarkContext::MarkCandidate> *)0x0) {
      this_local = (PageStack<Memory::MarkContext::MarkCandidate> *)0x0;
    }
    else {
      this->pageCount = this->pageCount + 1;
    }
  }
  else {
    this_local = (PageStack<Memory::MarkContext::MarkCandidate> *)0x0;
  }
  return (Chunk *)this_local;
}

Assistant:

typename PageStack<T>::Chunk * PageStack<T>::CreateChunk()
{
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (pageCount >= maxPageCount)
    {
        return nullptr;
    }
#endif
    Chunk * newChunk = (Chunk *)this->pagePool->GetPage(usesReservedPages);

    if (newChunk == nullptr)
    {
        return nullptr;
    }

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    pageCount++;
#endif
    return newChunk;
}